

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

MockActualCall_c * withActualParameterOfType_c(char *type,char *name,void *value)

{
  MockActualCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  SimpleString local_40;
  SimpleString local_30;
  void *local_20;
  void *value_local;
  char *name_local;
  char *type_local;
  
  pMVar1 = actualCall;
  local_20 = value;
  value_local = name;
  name_local = type;
  SimpleString::SimpleString(&local_30,type);
  SimpleString::SimpleString(&local_40,(char *)value_local);
  iVar2 = (*pMVar1->_vptr_MockActualCall[4])(pMVar1,&local_30,&local_40,local_20);
  actualCall = (MockActualCall *)CONCAT44(extraout_var,iVar2);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  return &gActualCall;
}

Assistant:

MockActualCall_c* withActualParameterOfType_c(const char* type, const char* name, const void* value)
{
    actualCall = &actualCall->withParameterOfType(type, name, value);
    return &gActualCall;
}